

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

int ps_alignment_iter_seg(ps_alignment_iter_t *itor,int *start,int *duration)

{
  ps_alignment_entry_t *ppVar1;
  ps_alignment_entry_t *ent;
  int *duration_local;
  int *start_local;
  ps_alignment_iter_t *itor_local;
  
  if (itor == (ps_alignment_iter_t *)0x0) {
    itor_local._4_4_ = 0;
  }
  else {
    ppVar1 = ps_alignment_iter_get(itor);
    if (start != (int *)0x0) {
      *start = ppVar1->start;
    }
    if (duration != (int *)0x0) {
      *duration = ppVar1->duration;
    }
    itor_local._4_4_ = ppVar1->score;
  }
  return itor_local._4_4_;
}

Assistant:

int
ps_alignment_iter_seg(ps_alignment_iter_t *itor, int *start, int *duration)
{
    ps_alignment_entry_t *ent;
    if (itor == NULL)
        return 0;
    ent = ps_alignment_iter_get(itor);
    if (start)
        *start = ent->start;
    if (duration)
        *duration = ent->duration;
    return ent->score;
}